

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O3

vector<signed_char,_std::allocator<signed_char>_> *
charls::anon_unknown_82::create_quantize_lut_lossless
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          int32_t bit_count)

{
  byte bVar1;
  uint uVar2;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  allocator_type local_29;
  
  if (0xf < bit_count - 1U) {
    __assert_fail("bits_per_sample > 0 && bits_per_sample <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/util.h"
                  ,0x1a7,"int32_t charls::calculate_maximum_sample_value(const int32_t)");
  }
  uVar10 = -1 << ((byte)bit_count & 0x1f);
  uVar6 = ~uVar10;
  if (uVar10 < 0xffffff80) {
    uVar11 = 0xfff;
    if (uVar6 < 0xfff) {
      uVar11 = uVar6;
    }
    uVar2 = uVar11 + 0x80 >> 8;
    uVar5 = uVar2 + 2;
    uVar11 = uVar11 + 0x80 >> 6 | 3;
    if (uVar11 <= uVar5) {
      uVar11 = uVar5;
    }
    uVar2 = uVar2 * 0x11 + 4;
    uVar12 = uVar11;
    if (uVar11 < uVar2) {
      uVar12 = uVar2;
    }
  }
  else {
    uVar5 = (uVar10 < 0xfffffffe) + 1;
    uVar11 = 3;
    if (0xfffffffc < uVar10) {
      uVar11 = uVar5;
    }
    bVar1 = (byte)(0x15 / ((ushort)(0x100 / (-uVar10 & 0xffff)) & 0xff));
    bVar4 = 4;
    if (4 < bVar1) {
      bVar4 = bVar1;
    }
    uVar2 = (uint)bVar4;
    uVar12 = (uint)bVar4;
  }
  if (uVar6 < uVar2) {
    uVar12 = uVar11;
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,(ulong)(uint)(2 << ((byte)bit_count & 0x1f)),&local_29);
  pvVar3 = (vector<signed_char,_std::allocator<signed_char>_> *)
           (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((vector<signed_char,_std::allocator<signed_char>_> *)
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    lVar7 = 0;
    do {
      iVar8 = uVar10 + (int)lVar7;
      cVar9 = -4;
      if (((iVar8 != -uVar12 && SBORROW4(iVar8,-uVar12) == (int)(iVar8 + uVar12) < 0) &&
          (cVar9 = -3, iVar8 != -uVar11 && SBORROW4(iVar8,-uVar11) == (int)(iVar8 + uVar11) < 0)) &&
         (cVar9 = -2, iVar8 != -uVar5 && SBORROW4(iVar8,-uVar5) == (int)(iVar8 + uVar5) < 0)) {
        if (iVar8 < 0) {
          cVar9 = -1;
        }
        else if (iVar8 == 0) {
          cVar9 = '\0';
        }
        else {
          cVar9 = '\x01';
          if (((int)uVar5 <= iVar8) && (cVar9 = '\x02', (int)uVar11 <= iVar8)) {
            cVar9 = '\x04' - (iVar8 < (int)uVar12);
          }
        }
      }
      *(char *)((long)&(pvVar3->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar7) = cVar9;
      lVar7 = lVar7 + 1;
      pvVar3 = (vector<signed_char,_std::allocator<signed_char>_> *)
               (__return_storage_ptr__->
               super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar7 != (long)(__return_storage_ptr__->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

vector<int8_t> create_quantize_lut_lossless(const int32_t bit_count)
{
    const jpegls_pc_parameters preset{compute_default(calculate_maximum_sample_value(bit_count), 0)};
    const int32_t range{preset.maximum_sample_value + 1};

    vector<int8_t> lut(static_cast<size_t>(range) * 2);
    for (size_t i{}; i != lut.size(); ++i)
    {
        lut[i] = quantize_gradient_org(preset, static_cast<int32_t>(i) - range);
    }

    return lut;
}